

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SplitNDLayerParams::InternalSwap
          (SplitNDLayerParams *this,SplitNDLayerParams *other)

{
  SplitNDLayerParams *other_local;
  SplitNDLayerParams *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->splitsizes_,&other->splitsizes_);
  google::protobuf::internal::memswap<16>((char *)&this->axis_,(char *)&other->axis_);
  return;
}

Assistant:

void SplitNDLayerParams::InternalSwap(SplitNDLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  splitsizes_.InternalSwap(&other->splitsizes_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(SplitNDLayerParams, numsplits_)
      + sizeof(SplitNDLayerParams::numsplits_)
      - PROTOBUF_FIELD_OFFSET(SplitNDLayerParams, axis_)>(
          reinterpret_cast<char*>(&axis_),
          reinterpret_cast<char*>(&other->axis_));
}